

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall
TPZSkylMatrix<double>::TPZSkylMatrix(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *A)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_018545d0;
  iVar1 = (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSkylMatrix_01852f60;
  TPZVec<double_*>::TPZVec(&this->fElem,0);
  TPZVec<double>::TPZVec(&this->fStorage,0);
  Copy(this,A);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }